

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

string * __thiscall
google::protobuf::Descriptor::DebugString_abi_cxx11_
          (string *__return_storage_ptr__,Descriptor *this)

{
  SubstituteArg local_210;
  SubstituteArg local_1e0;
  SubstituteArg local_1b0;
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_60.text_ = (char *)**(undefined8 **)this;
  local_60.size_ = *(int *)(*(undefined8 **)this + 1);
  local_90.text_ = (char *)0x0;
  local_90.size_ = -1;
  local_c0.text_ = (char *)0x0;
  local_c0.size_ = -1;
  local_f0.text_ = (char *)0x0;
  local_f0.size_ = -1;
  local_120.text_ = (char *)0x0;
  local_120.size_ = -1;
  local_150.text_ = (char *)0x0;
  local_150.size_ = -1;
  local_180.text_ = (char *)0x0;
  local_180.size_ = -1;
  local_1b0.text_ = (char *)0x0;
  local_1b0.size_ = -1;
  local_1e0.text_ = (char *)0x0;
  local_1e0.size_ = -1;
  local_210.text_ = (char *)0x0;
  local_210.size_ = -1;
  strings::SubstituteAndAppend
            (__return_storage_ptr__,"message $0",&local_60,&local_90,&local_c0,&local_f0,&local_120,
             &local_150,&local_180,&local_1b0,&local_1e0,&local_210);
  DebugString(this,0,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string Descriptor::DebugString() const {
  string contents;
  strings::SubstituteAndAppend(&contents, "message $0", name());
  DebugString(0, &contents);
  return contents;
}